

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv.cc
# Opt level: O0

void absl::anon_unknown_0::EncodeResult<double>
               (CalculatedFloat *calculated,bool negative,from_chars_result *result,double *value)

{
  double dVar1;
  double dVar2;
  float local_48;
  double local_30;
  double *value_local;
  from_chars_result *result_local;
  bool negative_local;
  CalculatedFloat *calculated_local;
  
  if (calculated->exponent == 99999) {
    result->ec = result_out_of_range;
    dVar1 = std::numeric_limits<double>::max();
    dVar2 = std::numeric_limits<double>::max();
    local_30 = -dVar1;
    if (!negative) {
      local_30 = dVar2;
    }
    *value = local_30;
  }
  else if ((calculated->mantissa == 0) || (calculated->exponent == -99999)) {
    result->ec = result_out_of_range;
    local_48 = -0.0;
    if (!negative) {
      local_48 = 0.0;
    }
    *value = (double)local_48;
  }
  else {
    dVar1 = FloatTraits<double>::Make(calculated->mantissa,calculated->exponent,negative);
    *value = dVar1;
  }
  return;
}

Assistant:

void EncodeResult(const CalculatedFloat& calculated, bool negative,
                  absl::from_chars_result* absl_nonnull result,
                  FloatType* absl_nonnull value) {
  if (calculated.exponent == kOverflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -std::numeric_limits<FloatType>::max()
                      : std::numeric_limits<FloatType>::max();
    return;
  } else if (calculated.mantissa == 0 || calculated.exponent == kUnderflow) {
    result->ec = std::errc::result_out_of_range;
    *value = negative ? -0.0f : 0.0f;
    return;
  }
  *value = FloatTraits<FloatType>::Make(
      static_cast<typename FloatTraits<FloatType>::mantissa_t>(
          calculated.mantissa),
      calculated.exponent, negative);
}